

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O0

void symtab_del(symtab *tab)

{
  int local_14;
  int i;
  symtab *tab_local;
  
  for (local_14 = 0; local_14 < tab->symsnum; local_14 = local_14 + 1) {
    free(tab->syms[local_14].name);
  }
  free(tab->buckets);
  free(tab->syms);
  free(tab);
  return;
}

Assistant:

void symtab_del(struct symtab *tab) {
	int i;
	for (i = 0; i < tab->symsnum; i++)
		free(tab->syms[i].name);
	free(tab->buckets);
	free(tab->syms);
	free(tab);
}